

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O1

int AF_A_FireRailgun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  void *pvVar7;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00594d2f;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar8 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (self->super_DThinker).super_DObject.Class;
      bVar10 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar8 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar10);
      if (pPVar6 != pPVar3 && !bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00594d2f;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_00594d04;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00594d2f;
        }
      }
    }
    if ((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) {
      pvVar7 = (void *)0x0;
    }
    else {
      if ((VVar1 != '\x03') ||
         ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
        goto LAB_00594d2f;
      }
      pvVar7 = param[2].field_0.field_1.a;
    }
    if (pvVar7 == (void *)0x0 || self->player == (player_t *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = *(int *)((long)pvVar7 + 8) == 1;
    }
    FireRailgun(self,0,bVar10);
    return 0;
  }
LAB_00594d04:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00594d2f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x241,"int AF_A_FireRailgun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireRailgun)
{
	PARAM_ACTION_PROLOGUE;
	FireRailgun(self, 0, ACTION_CALL_FROM_PSPRITE());
	return 0;
}